

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternSelection.cpp
# Opt level: O0

TrackMeta __thiscall PatternSelection::Iterator::getTrackMeta(Iterator *this,int track)

{
  int local_2c;
  int local_28;
  int end;
  int start;
  int track_local;
  Iterator *this_local;
  
  if (track == (this->mStart).super_PatternCursorBase.track) {
    local_28 = (this->mStart).super_PatternCursorBase.column;
  }
  else {
    local_28 = 0;
  }
  if (track == (this->mEnd).super_PatternCursorBase.track) {
    local_2c = (this->mEnd).super_PatternCursorBase.column;
  }
  else {
    local_2c = 4;
  }
  TrackMeta::TrackMeta((TrackMeta *)&this_local,local_28,local_2c);
  return _this_local;
}

Assistant:

PatternSelection::TrackMeta PatternSelection::Iterator::getTrackMeta(int track) const {
    int start;
    int end;

    if (track == mStart.track) {
        start = mStart.column;
    } else {
        start = 0;
    }

    if (track == mEnd.track) {
        end = mEnd.column;
    } else {
        end = PatternAnchor::MAX_SELECTS - 1;
    }

    return { start, end };
}